

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSchema
          (MessageGenerator *this,Printer *printer,int offset,int has_offset)

{
  bool bVar1;
  mapped_type *pmVar2;
  FileDescriptor *file;
  int i;
  int i_00;
  allocator local_119;
  key_type local_118;
  byte local_f2;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  key_type local_c8;
  string local_a8;
  allocator local_71;
  key_type local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  int has_offset_local;
  int offset_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = has_offset;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = offset;
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (!bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"classname",&local_71);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_70);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&this->classname_);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    SimpleItoa_abi_cxx11_
              (&local_a8,
               (protobuf *)(ulong)vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,i);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"offset",&local_c9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_c8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)&local_a8);
    local_f2 = 0;
    file = Descriptor::file(this->descriptor_);
    bVar1 = HasFieldPresence(file);
    if (bVar1) {
      SimpleItoa_abi_cxx11_
                (&local_f0,
                 (protobuf *)
                 (ulong)(vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ +
                        (int)vars._M_t._M_impl.super__Rb_tree_header._M_node_count),i_00);
    }
    else {
      std::allocator<char>::allocator();
      local_f2 = 1;
      std::__cxx11::string::string((string *)&local_f0,"-1",&local_f1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"has_bits_offsets",&local_119);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_118);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    if ((local_f2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,"{ $offset$, $has_bits_offsets$, sizeof($classname$)},\n"
                      );
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSchema(io::Printer* printer, int offset,
                                      int has_offset) {
  if (IsMapEntryMessage(descriptor_)) return;

  std::map<string, string> vars;

  vars["classname"] = classname_;
  vars["offset"] = SimpleItoa(offset);
  vars["has_bits_offsets"] = HasFieldPresence(descriptor_->file())
                                 ? SimpleItoa(offset + has_offset)
                                 : "-1";

  printer->Print(vars,
                 "{ $offset$, $has_bits_offsets$, sizeof($classname$)},\n");
}